

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutils.h
# Opt level: O2

string * rtrim(string *__return_storage_ptr__,string *str)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_30;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_30,"\\s+$",0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,str,&local_30,&local_50,0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_30);
  return __return_storage_ptr__;
}

Assistant:

string rtrim(const string& str) {
    return regex_replace(str, regex("\\s+$"), string(""));
}